

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<unsigned_int> *
wasm::WATParser::labelidx<wasm::WATParser::ParseDefsCtx>
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *ctx,bool inDelegate)

{
  string local_b0 [32];
  string local_90;
  undefined1 local_70 [8];
  MaybeResult<unsigned_int> _val;
  MaybeResult<unsigned_int> idx;
  
  maybeLabelidx<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<unsigned_int> *)
             ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err> + 0x20),ctx,
             inDelegate);
  if (idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err> *)
                      ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err> + 0x20));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"expected label index or identifier",(allocator<char> *)local_70)
    ;
    Lexer::err((Err *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err> + 0x20),
               &ctx->in,&local_90);
    std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err> + 0x20));
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_unsigned_int,_wasm::None,_wasm::Err> *)local_70,
                    (_Copy_ctor_base<false,_unsigned_int,_wasm::None,_wasm::Err> *)
                    ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err> + 0x20));
    if (_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string(local_b0,(string *)local_70);
      std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err> *)local_70);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err> *)local_70);
      *(undefined4 *)
       &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err> =
           _val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._32_4_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err> *)
                      ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err> + 0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LabelIdxT> labelidx(Ctx& ctx, bool inDelegate) {
  if (auto idx = maybeLabelidx(ctx, inDelegate)) {
    CHECK_ERR(idx);
    return *idx;
  }
  return ctx.in.err("expected label index or identifier");
}